

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

Vec_Int_t *
Gla_ManUnsatCore(Gla_Man_t *p,int f,sat_solver2 *pSat,int nConfMax,int fVerbose,int *piRetValue,
                int *pnConfls)

{
  abctime clk;
  int local_48;
  int iLit;
  int RetValue;
  int nConfPrev;
  Vec_Int_t *vCore;
  int *piRetValue_local;
  int fVerbose_local;
  int nConfMax_local;
  sat_solver2 *pSat_local;
  Gla_Man_t *pGStack_18;
  int f_local;
  Gla_Man_t *p_local;
  
  _RetValue = (Gla_Man_t *)0x0;
  iLit = (int)(pSat->stats).conflicts;
  vCore = (Vec_Int_t *)piRetValue;
  piRetValue_local._0_4_ = fVerbose;
  piRetValue_local._4_4_ = nConfMax;
  _fVerbose_local = pSat;
  pSat_local._4_4_ = f;
  pGStack_18 = p;
  clk._4_4_ = Gla_ManGetOutLit(p,f);
  Abc_Clock();
  if (vCore != (Vec_Int_t *)0x0) {
    vCore->nCap = 1;
  }
  if (clk._4_4_ == -1) {
    _RetValue = (Gla_Man_t *)Vec_IntAlloc(1);
    Vec_IntPush((Vec_Int_t *)_RetValue,pGStack_18->pObjRoot->Fanins[0]);
    p_local = _RetValue;
  }
  else {
    local_48 = sat_solver2_solve(_fVerbose_local,(lit *)((long)&clk + 4),&local_48,
                                 (long)piRetValue_local._4_4_,0,0,0);
    if (pnConfls != (int *)0x0) {
      *pnConfls = (int)(_fVerbose_local->stats).conflicts - iLit;
    }
    if (local_48 == 0) {
      if (vCore != (Vec_Int_t *)0x0) {
        vCore->nCap = -1;
      }
      p_local = (Gla_Man_t *)0x0;
    }
    else if (local_48 == 1) {
      if (vCore != (Vec_Int_t *)0x0) {
        vCore->nCap = 0;
      }
      p_local = (Gla_Man_t *)0x0;
    }
    else {
      if (local_48 != -1) {
        __assert_fail("RetValue == l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                      ,0x5cb,
                      "Vec_Int_t *Gla_ManUnsatCore(Gla_Man_t *, int, sat_solver2 *, int, int, int *, int *)"
                     );
      }
      Abc_Clock();
      _RetValue = (Gla_Man_t *)Sat_ProofCore(_fVerbose_local);
      if (_RetValue != (Gla_Man_t *)0x0) {
        Vec_IntSort((Vec_Int_t *)_RetValue,1);
      }
      p_local = _RetValue;
    }
  }
  return (Vec_Int_t *)p_local;
}

Assistant:

Vec_Int_t * Gla_ManUnsatCore( Gla_Man_t * p, int f, sat_solver2 * pSat, int nConfMax, int fVerbose, int * piRetValue, int * pnConfls )
{
    Vec_Int_t * vCore = NULL;
    int nConfPrev = pSat->stats.conflicts;
    int RetValue, iLit = Gla_ManGetOutLit( p, f );
    abctime clk = Abc_Clock();
    if ( piRetValue )
        *piRetValue = 1;
    // consider special case when PO points to the flop
    // this leads to immediate conflict in the first timeframe
    if ( iLit == -1 )
    {
        vCore = Vec_IntAlloc( 1 );
        Vec_IntPush( vCore, p->pObjRoot->Fanins[0] );
        return vCore;
    }
    // solve the problem
    RetValue = sat_solver2_solve( pSat, &iLit, &iLit+1, (ABC_INT64_T)nConfMax, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( pnConfls )
        *pnConfls = (int)pSat->stats.conflicts - nConfPrev;
    if ( RetValue == l_Undef )
    {
        if ( piRetValue )
            *piRetValue = -1;
        return NULL;
    }
    if ( RetValue == l_True )
    {
        if ( piRetValue )
            *piRetValue = 0;
        return NULL;
    }
    if ( fVerbose )
    {
//        Abc_Print( 1, "%6d", (int)pSat->stats.conflicts - nConfPrev );
//        Abc_Print( 1, "UNSAT after %7d conflicts.      ", pSat->stats.conflicts );
//        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    assert( RetValue == l_False );
    // derive the UNSAT core
    clk = Abc_Clock();
    vCore = (Vec_Int_t *)Sat_ProofCore( pSat );
    if ( vCore )
        Vec_IntSort( vCore, 1 );
    if ( fVerbose )
    {
//        Abc_Print( 1, "Core is %8d vars    (out of %8d).   ", Vec_IntSize(vCore), sat_solver2_nvars(pSat) );
//        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    return vCore;
}